

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_rangeproof_rewind
              (secp256k1_context *ctx,uchar *blind_out,uint64_t *value_out,uchar *message_out,
              size_t *outlen,uchar *nonce,uint64_t *min_value,uint64_t *max_value,
              secp256k1_pedersen_commitment *commit,uchar *proof,size_t plen,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  int iVar1;
  long in_RCX;
  secp256k1_ecmult_context *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  secp256k1_ge genp;
  secp256k1_ge commitp;
  size_t *in_stack_00006240;
  uchar *in_stack_00006248;
  uint64_t *in_stack_00006250;
  uchar *in_stack_00006258;
  secp256k1_ecmult_gen_context *in_stack_00006260;
  secp256k1_ecmult_context *in_stack_00006268;
  uchar *in_stack_000062a0;
  uint64_t *in_stack_000062a8;
  uint64_t *in_stack_000062b0;
  secp256k1_ge *in_stack_000062b8;
  uchar *in_stack_000062c0;
  size_t in_stack_000062c8;
  uchar *in_stack_000062d0;
  size_t in_stack_000062d8;
  secp256k1_ge *in_stack_000062e0;
  secp256k1_generator *in_stack_fffffffffffffe98;
  secp256k1_ge *in_stack_fffffffffffffea0;
  secp256k1_pedersen_commitment *in_stack_fffffffffffffeb8;
  secp256k1_ge *in_stack_fffffffffffffec0;
  int local_34;
  
  if (in_stack_00000018 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_stack_00000020 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_stack_00000008 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_stack_00000010 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_RCX == 0 && in_R8 != 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_R9 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_stack_00000030 == 0 && in_stack_00000038 != 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else if (in_stack_00000040 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
    local_34 = 0;
  }
  else {
    iVar1 = secp256k1_ecmult_context_is_built(in_RDI);
    if (iVar1 == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
      local_34 = 0;
    }
    else {
      iVar1 = secp256k1_ecmult_gen_context_is_built((secp256k1_ecmult_gen_context *)(in_RDI + 1));
      if (iVar1 == 0) {
        secp256k1_callback_call
                  ((secp256k1_callback *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98
                  );
        local_34 = 0;
      }
      else {
        secp256k1_pedersen_commitment_load(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        secp256k1_generator_load(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        local_34 = secp256k1_rangeproof_verify_impl
                             (in_stack_00006268,in_stack_00006260,in_stack_00006258,
                              in_stack_00006250,in_stack_00006248,in_stack_00006240,
                              in_stack_000062a0,in_stack_000062a8,in_stack_000062b0,
                              in_stack_000062b8,in_stack_000062c0,in_stack_000062c8,
                              in_stack_000062d0,in_stack_000062d8,in_stack_000062e0);
      }
    }
  }
  return local_34;
}

Assistant:

int secp256k1_rangeproof_rewind(const secp256k1_context* ctx,
 unsigned char *blind_out, uint64_t *value_out, unsigned char *message_out, size_t *outlen, const unsigned char *nonce,
 uint64_t *min_value, uint64_t *max_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *proof, size_t plen, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen) {
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(message_out != NULL || outlen == NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_verify_impl(&ctx->ecmult_ctx, &ctx->ecmult_gen_ctx,
     blind_out, value_out, message_out, outlen, nonce, min_value, max_value, &commitp, proof, plen, extra_commit, extra_commit_len, &genp);
}